

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

IterationResult __thiscall helics::Federate::enterExecutingModeComplete(Federate *this)

{
  iteration_time res_00;
  IterationResult IVar1;
  Modes MVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDI;
  iteration_time iVar3;
  exception *anon_var_0;
  iteration_time res;
  handle asyncInfo;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *this_00;
  future<helics::iteration_time> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffb1;
  undefined7 uStack_2f;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (((in_RDI._M_pi)->_M_weak_count & 0x10000) == 0) {
    MVar2 = CLI::std::atomic<helics::Federate::Modes>::load
                      ((atomic<helics::Federate::Modes> *)&(in_RDI._M_pi)->_M_use_count,seq_cst);
    if (MVar2 == PENDING_EXEC) {
      std::
      unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
      ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                    *)0x210695);
      this_00 = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)&stack0xffffffffffffffd8;
      gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock(this_00);
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)this_00);
      iVar3 = std::future<helics::iteration_time>::get(in_stack_ffffffffffffff88);
      IVar1 = iVar3.state;
      res_00._9_7_ = in_stack_ffffffffffffffb1;
      res_00.grantedTime.internalTimeCode = (long)iVar3._0_9_;
      res_00.state = (char)((unkuint9)iVar3._0_9_ >> 0x40);
      enteringExecutingMode((Federate *)CONCAT71(uStack_2f,IVar1),res_00);
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
                ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x210781);
    }
    else {
      IVar1 = enterExecutingMode((Federate *)
                                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                 (IterationRequest)((ulong)in_RDI._M_pi >> 0x38));
    }
  }
  else {
    IVar1 = enterExecutingMode((Federate *)
                               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                               (IterationRequest)((ulong)in_RDI._M_pi >> 0x38));
  }
  return IVar1;
}

Assistant:

IterationResult Federate::enterExecutingModeComplete()
{
    if (singleThreadFederate) {
        return enterExecutingMode();
    }
    switch (currentMode.load()) {
        case Modes::PENDING_EXEC: {
            auto asyncInfo = asyncCallInfo->lock();
            try {
                auto res = asyncInfo->execFuture.get();
                enteringExecutingMode(res);
                return res.state;
            }
            catch (const std::exception&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
        }
        default:
            return enterExecutingMode();
    }
}